

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock_internal.cc
# Opt level: O0

int base::internal::SuggestedDelayNS(int loop)

{
  uint64_t r;
  int loop_local;
  
  SuggestedDelayNS::rand = SuggestedDelayNS::rand * 0x5deece66d + 0xb;
  if ((loop < 0) || (loop_local = loop, 0x20 < loop)) {
    loop_local = 0x20;
  }
  return (int)(SuggestedDelayNS::rand * 0x10000 >> (0x2cU - (char)(loop_local >> 3) & 0x3f));
}

Assistant:

static int SuggestedDelayNS(int loop) {
  // Weak pseudo-random number generator to get some spread between threads
  // when many are spinning.
  static volatile uint64_t rand;
  uint64_t r = rand;
  r = 0x5deece66dLL * r + 0xb;   // numbers from nrand48()
  rand = r;

  r <<= 16;   // 48-bit random number now in top 48-bits.
  if (loop < 0 || loop > 32) {   // limit loop to 0..32
    loop = 32;
  }
  // loop>>3 cannot exceed 4 because loop cannot exceed 32.
  // Select top 20..24 bits of lower 48 bits,
  // giving approximately 0ms to 16ms.
  // Mean is exponential in loop for first 32 iterations, then 8ms.
  // The futex path multiplies this by 16, since we expect explicit wakeups
  // almost always on that path.
  return r >> (44 - (loop >> 3));
}